

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 12_string_object.cpp
# Opt level: O2

void display_all_strings(string *list,int n)

{
  ostream *poVar1;
  
  if (n < 1) {
    n = 0;
  }
  if (n != 0) {
    poVar1 = (ostream *)std::ostream::operator<<(&std::cout,1);
    std::operator<<(poVar1," : ");
  }
  return;
}

Assistant:

void display_all_strings(const std::string list[], int n) {
    for(int i = 0; i < n; i++) {
        std::cout << i + 1 << " : " << list[i] << std::endl;
    }
}